

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O1

void __thiscall r_comp::RepliStruct::RepliStruct(RepliStruct *this,Type type)

{
  (this->cmd)._M_dataplus._M_p = (pointer)&(this->cmd).field_2;
  (this->cmd)._M_string_length = 0;
  (this->cmd).field_2._M_local_buf[0] = '\0';
  (this->tail)._M_dataplus._M_p = (pointer)&(this->tail).field_2;
  (this->tail)._M_string_length = 0;
  (this->tail).field_2._M_local_buf[0] = '\0';
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  (this->error)._M_dataplus._M_p = (pointer)&(this->error).field_2;
  (this->error)._M_string_length = 0;
  (this->error).field_2._M_local_buf[0] = '\0';
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  (this->args).
  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).
  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).
  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->type = type;
  std::__cxx11::string::_M_assign((string *)&this->fileName);
  this->line = GlobalLine;
  this->parent = (RepliStruct *)0x0;
  return;
}

Assistant:

RepliStruct::RepliStruct(RepliStruct::Type type)
{
    //    std::cout << "creating strucT: " << GlobalFilename << GlobalLine << std::endl;
    this->type = type;
    this->fileName = GlobalFilename;
    line = GlobalLine;
    parent = nullptr;
}